

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Parser::_move_val_tag_to_key_tag(Parser *this)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  bool bVar5;
  
  pcVar1 = (this->m_val_tag).str;
  if (pcVar1 != (char *)0x0 && (this->m_val_tag).len != 0) {
    sVar2 = (this->m_val_tag).len;
    pcVar3 = (this->m_state->line_contents).full.str;
    sVar4 = (this->m_state->line_contents).full.len;
    if (sVar4 == 0) {
      if (sVar2 != 0) {
        return;
      }
      bVar5 = pcVar3 != (char *)0x0 && pcVar3 == pcVar1;
    }
    else {
      bVar5 = pcVar1 + sVar2 <= pcVar3 + sVar4 && pcVar3 <= pcVar1;
    }
    if (bVar5) {
      sVar2 = (this->m_val_tag).len;
      (this->m_key_tag).str = (this->m_val_tag).str;
      (this->m_key_tag).len = sVar2;
      this->m_key_tag_indentation = this->m_val_tag_indentation;
      this->m_val_tag_indentation = 0;
      (this->m_val_tag).str = (char *)0x0;
      (this->m_val_tag).len = 0;
    }
  }
  return;
}

Assistant:

C4_ALWAYS_INLINE C4_PURE bool   empty()     const noexcept { return (len == 0 || str == nullptr); }